

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_validator_options.cpp
# Opt level: O1

spv_validator_options spvValidatorOptionsCreate(void)

{
  spv_validator_options psVar1;
  
  psVar1 = (spv_validator_options)operator_new(0x30);
  (psVar1->universal_limits_).max_struct_members = 0x3fff;
  (psVar1->universal_limits_).max_struct_depth = 0xff;
  (psVar1->universal_limits_).max_local_variables = 0x7ffff;
  (psVar1->universal_limits_).max_global_variables = 0xffff;
  (psVar1->universal_limits_).max_switch_branches = 0x3fff;
  (psVar1->universal_limits_).max_function_args = 0xff;
  (psVar1->universal_limits_).max_control_flow_nesting_depth = 0x3ff;
  (psVar1->universal_limits_).max_access_chain_indexes = 0xff;
  (psVar1->universal_limits_).max_id_bound = 0x3fffff;
  psVar1->relax_struct_store = false;
  psVar1->relax_logical_pointer = false;
  psVar1->relax_block_layout = false;
  psVar1->uniform_buffer_standard_layout = false;
  psVar1->scalar_block_layout = false;
  psVar1->workgroup_scalar_block_layout = false;
  psVar1->skip_block_layout = false;
  psVar1->allow_localsizeid = false;
  psVar1->before_hlsl_legalization = false;
  psVar1->use_friendly_names = true;
  return psVar1;
}

Assistant:

spv_validator_options spvValidatorOptionsCreate(void) {
  return new spv_validator_options_t;
}